

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O2

void rehashtab(lua_State *L,GCtab *t,cTValue *ek)

{
  uint32_t i;
  uint32_t uVar1;
  int iVar2;
  long lVar3;
  uint32_t b;
  uint32_t hbits;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  uint32_t bins [28];
  
  for (lVar3 = 0; lVar3 != 0x1c; lVar3 = lVar3 + 1) {
    bins[lVar3] = 0;
  }
  uVar10 = t->asize;
  uVar11 = 0;
  iVar12 = 0;
  if (uVar10 != 0) {
    lVar3 = 0;
    iVar12 = 0;
    uVar4 = 0;
    while ((uVar5 = (uint)uVar4, lVar3 != 0x1c &&
           ((uVar6 = 2 << ((byte)lVar3 & 0x1f), uVar6 < uVar10 ||
            (uVar6 = uVar10 - 1, uVar5 <= uVar10 - 1))))) {
      uVar7 = uVar6 + 1;
      if (uVar6 + 1 < uVar5) {
        uVar7 = uVar5;
      }
      iVar8 = 0;
      for (; uVar7 != (uint)uVar4; uVar4 = (ulong)((uint)uVar4 + 1)) {
        iVar8 = iVar8 + (uint)(*(int *)((ulong)(t->array).ptr32 + 4 + uVar4 * 8) != -1);
      }
      bins[lVar3] = bins[lVar3] + iVar8;
      iVar12 = iVar12 + iVar8;
      lVar3 = lVar3 + 1;
      uVar4 = (ulong)uVar7;
    }
  }
  uVar4 = (ulong)(t->node).ptr32;
  uVar10 = t->hmask;
  iVar8 = 0;
  iVar13 = 0;
  for (; uVar11 <= uVar10; uVar11 = uVar11 + 1) {
    if (*(int *)(uVar4 + 4 + (ulong)uVar11 * 0x18) != -1) {
      uVar1 = countint((cTValue *)((ulong)uVar11 * 0x18 + uVar4 + 8),bins);
      iVar8 = iVar8 + uVar1;
      iVar13 = iVar13 + 1;
    }
  }
  uVar1 = countint(ek,bins);
  iVar2 = uVar1 + iVar8 + iVar12;
  iVar9 = 0;
  iVar8 = 0;
  uVar1 = 0;
  uVar4 = 0;
  while( true ) {
    uVar10 = 1 << ((byte)uVar4 & 0x1f);
    if (((uint)(iVar2 * 2) <= uVar10) || (iVar9 == iVar2)) break;
    if ((bins[uVar4] != 0) && (iVar9 = bins[uVar4] + iVar9, uVar10 < (uint)(iVar9 * 2))) {
      uVar1 = (2 << ((byte)uVar4 & 0x1f)) + 1;
      iVar8 = iVar9;
    }
    uVar4 = (ulong)((int)uVar4 + 1);
  }
  iVar8 = (iVar12 + iVar13 + 1) - iVar8;
  hbits = 0;
  if ((iVar8 != 0) && (hbits = 1, iVar8 != 1)) {
    uVar10 = 0x1f;
    if (iVar8 - 1U != 0) {
      for (; iVar8 - 1U >> uVar10 == 0; uVar10 = uVar10 - 1) {
      }
    }
    hbits = (uVar10 ^ 0xffffffe0) + 0x21;
  }
  resizetab(L,t,uVar1,hbits);
  return;
}

Assistant:

static void rehashtab(lua_State *L, GCtab *t, cTValue *ek)
{
  uint32_t bins[LJ_MAX_ABITS];
  uint32_t total, asize, na, i;
  for (i = 0; i < LJ_MAX_ABITS; i++) bins[i] = 0;
  asize = countarray(t, bins);
  total = 1 + asize;
  total += counthash(t, bins, &asize);
  asize += countint(ek, bins);
  na = bestasize(bins, &asize);
  total -= na;
  resizetab(L, t, asize, hsize2hbits(total));
}